

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::ClientWaitNoTimeoutTest::iterate(ClientWaitNoTimeoutTest *this)

{
  deUint32 err;
  deBool dVar1;
  EGLSyncKHR pvVar2;
  MessageBuilder *pMVar3;
  TestError *pTVar4;
  MessageBuilder local_340;
  int local_1bc;
  char *pcStack_1b8;
  EGLint status;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  Library *egl;
  ClientWaitNoTimeoutTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_20 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar2 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar2;
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a0,&(this->super_SyncTest).m_sync);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_eglDisplay);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pcStack_1b8 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xfffffffffffffe48);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2c57cb5);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  err = (*(code *)log->m_log[6].lock)();
  eglu::checkError(err,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x1d5);
  local_1bc = (**(code **)&log->m_log->isSessionOpen)
                        (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,0,0);
  tcu::TestLog::operator<<(&local_340,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_340,&local_1bc);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [25])" = eglClientWaitSyncKHR(");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_eglDisplay);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_sync);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2c037f0);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_340);
  if ((this->super_SyncTest).m_syncType == 0x30f9) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || ((local_1bc != 0x30f6 && (local_1bc != 0x30f5)))) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,(char *)0x0,
                   "status == EGL_CONDITION_SATISFIED_KHR || status == EGL_TIMEOUT_EXPIRED_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x1db);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
  }
  else if ((this->super_SyncTest).m_syncType == 0x30fa) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (local_1bc != 0x30f5)) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,(char *)0x0,"status == EGL_TIMEOUT_EXPIRED_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x1dd);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
  }
  tcu::TestContext::setTestResult
            ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint status = egl.clientWaitSyncKHR(m_eglDisplay, m_sync, 0, 0);
		log << TestLog::Message << status << " = eglClientWaitSyncKHR(" << m_eglDisplay << ", " << m_sync << ", 0, 0)" << TestLog::EndMessage;

		if (m_syncType == EGL_SYNC_FENCE_KHR)
			TCU_CHECK(status == EGL_CONDITION_SATISFIED_KHR || status == EGL_TIMEOUT_EXPIRED_KHR);
		else if (m_syncType == EGL_SYNC_REUSABLE_KHR)
			TCU_CHECK(status == EGL_TIMEOUT_EXPIRED_KHR);
		else
			DE_ASSERT(DE_FALSE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}